

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O2

t_int * voutlet_perform(t_int *w)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  t_int tVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  
  lVar2 = w[1];
  lVar3 = w[2];
  tVar4 = w[3];
  pfVar5 = *(float **)(lVar2 + 0x60);
  pfVar7 = pfVar5;
  for (lVar6 = 0; (int)tVar4 != (int)lVar6; lVar6 = lVar6 + 1) {
    pfVar1 = pfVar7 + 1;
    *pfVar7 = *(float *)(lVar3 + lVar6 * 4) + *pfVar7;
    pfVar7 = pfVar1;
    if (pfVar1 == *(float **)(lVar2 + 0x50)) {
      pfVar7 = *(float **)(lVar2 + 0x48);
    }
  }
  pfVar5 = pfVar5 + *(int *)(lVar2 + 0x68);
  if (*(float **)(lVar2 + 0x50) <= pfVar5) {
    pfVar5 = *(float **)(lVar2 + 0x48);
  }
  *(float **)(lVar2 + 0x60) = pfVar5;
  return w + 4;
}

Assistant:

t_int *voutlet_perform(t_int *w)
{
    t_voutlet *x = (t_voutlet *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample *out = x->x_write, *outwas = out;
    while (n--)
    {
        *out++ += *in++;
        if (out == x->x_endbuf) out = x->x_buf;
    }
    outwas += x->x_hop;
    if (outwas >= x->x_endbuf) outwas = x->x_buf;
    x->x_write = outwas;
    return (w+4);
}